

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::Read(Benchmark *this,Order order,int entries_per_batch)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int j;
  sqlite3_stmt *read_stmt;
  sqlite3_stmt *end_trans_stmt;
  sqlite3_stmt *begin_trans_stmt;
  int local_104;
  Random *local_100;
  string read_str;
  string end_trans_str;
  string begin_trans_str;
  char key [100];
  
  std::__cxx11::string::string
            ((string *)&read_str,"SELECT * FROM test WHERE key = ?",(allocator *)key);
  std::__cxx11::string::string((string *)&begin_trans_str,"BEGIN TRANSACTION;",(allocator *)key);
  std::__cxx11::string::string((string *)&end_trans_str,"END TRANSACTION;",(allocator *)key);
  iVar1 = sqlite3_prepare_v2(this->db_,begin_trans_str._M_dataplus._M_p,0xffffffff,&begin_trans_stmt
                             ,0);
  ErrorCheck(iVar1);
  iVar1 = sqlite3_prepare_v2(this->db_,end_trans_str._M_dataplus._M_p,0xffffffff,&end_trans_stmt,0);
  ErrorCheck(iVar1);
  iVar1 = sqlite3_prepare_v2(this->db_,read_str._M_dataplus._M_p,0xffffffff,&read_stmt,0);
  ErrorCheck(iVar1);
  local_100 = &this->rand_;
  iVar1 = 0;
  if (0 < entries_per_batch) {
    iVar1 = entries_per_batch;
  }
  local_104 = entries_per_batch;
  for (iVar5 = 0; iVar5 < this->reads_; iVar5 = iVar5 + entries_per_batch) {
    if ((1 < entries_per_batch) && ((FLAGS_transaction & 1) == 0)) {
      iVar2 = sqlite3_step(begin_trans_stmt);
      StepErrorCheck(iVar2);
      iVar2 = sqlite3_reset(begin_trans_stmt);
      ErrorCheck(iVar2);
    }
    for (iVar2 = 0; entries_per_batch = local_104, iVar2 != iVar1; iVar2 = iVar2 + 1) {
      if (order == SEQUENTIAL) {
        uVar6 = (ulong)(uint)(iVar2 + iVar5);
      }
      else {
        uVar3 = Random::Next(local_100);
        uVar6 = (ulong)uVar3 % (ulong)(uint)this->reads_;
      }
      snprintf(key,100,"%016d",uVar6);
      iVar4 = sqlite3_bind_blob(read_stmt,1,(allocator *)key,0x10,0);
      ErrorCheck(iVar4);
      do {
        iVar4 = sqlite3_step(read_stmt);
      } while (iVar4 == 100);
      StepErrorCheck(iVar4);
      iVar4 = sqlite3_clear_bindings(read_stmt);
      ErrorCheck(iVar4);
      iVar4 = sqlite3_reset(read_stmt);
      ErrorCheck(iVar4);
      FinishedSingleOp(this);
    }
    if ((1 < local_104) && ((FLAGS_transaction & 1) == 0)) {
      iVar2 = sqlite3_step(end_trans_stmt);
      StepErrorCheck(iVar2);
      iVar2 = sqlite3_reset(end_trans_stmt);
      ErrorCheck(iVar2);
    }
  }
  iVar1 = sqlite3_finalize(read_stmt);
  ErrorCheck(iVar1);
  iVar1 = sqlite3_finalize(begin_trans_stmt);
  ErrorCheck(iVar1);
  iVar1 = sqlite3_finalize(end_trans_stmt);
  ErrorCheck(iVar1);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Read(Order order, int entries_per_batch) {
    int status;
    sqlite3_stmt *read_stmt, *begin_trans_stmt, *end_trans_stmt;

    std::string read_str = "SELECT * FROM test WHERE key = ?";
    std::string begin_trans_str = "BEGIN TRANSACTION;";
    std::string end_trans_str = "END TRANSACTION;";

    // Preparing sqlite3 statements
    status = sqlite3_prepare_v2(db_, begin_trans_str.c_str(), -1,
                                &begin_trans_stmt, nullptr);
    ErrorCheck(status);
    status = sqlite3_prepare_v2(db_, end_trans_str.c_str(), -1, &end_trans_stmt,
                                nullptr);
    ErrorCheck(status);
    status = sqlite3_prepare_v2(db_, read_str.c_str(), -1, &read_stmt, nullptr);
    ErrorCheck(status);

    bool transaction = (entries_per_batch > 1);
    for (int i = 0; i < reads_; i += entries_per_batch) {
      // Begin read transaction
      if (FLAGS_transaction && transaction) {
        status = sqlite3_step(begin_trans_stmt);
        StepErrorCheck(status);
        status = sqlite3_reset(begin_trans_stmt);
        ErrorCheck(status);
      }

      // Create and execute SQL statements
      for (int j = 0; j < entries_per_batch; j++) {
        // Create key value
        char key[100];
        int k = (order == SEQUENTIAL) ? i + j : (rand_.Next() % reads_);
        std::snprintf(key, sizeof(key), "%016d", k);

        // Bind key value into read_stmt
        status = sqlite3_bind_blob(read_stmt, 1, key, 16, SQLITE_STATIC);
        ErrorCheck(status);

        // Execute read statement
        while ((status = sqlite3_step(read_stmt)) == SQLITE_ROW) {
        }
        StepErrorCheck(status);

        // Reset SQLite statement for another use
        status = sqlite3_clear_bindings(read_stmt);
        ErrorCheck(status);
        status = sqlite3_reset(read_stmt);
        ErrorCheck(status);
        FinishedSingleOp();
      }

      // End read transaction
      if (FLAGS_transaction && transaction) {
        status = sqlite3_step(end_trans_stmt);
        StepErrorCheck(status);
        status = sqlite3_reset(end_trans_stmt);
        ErrorCheck(status);
      }
    }

    status = sqlite3_finalize(read_stmt);
    ErrorCheck(status);
    status = sqlite3_finalize(begin_trans_stmt);
    ErrorCheck(status);
    status = sqlite3_finalize(end_trans_stmt);
    ErrorCheck(status);
  }